

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O1

void cppqc::detail::TupleGeneratorHelper_shrink<0,std::vector<int,std::allocator<int>>>::
     appendShrinks<std::tuple<cppqc::Generator<std::vector<int,std::allocator<int>>>>>
               (tuple<std::vector<int,_std::allocator<int>_>_> *shrinkInput,
               vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
               *shrinkOutput,
               tuple<cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_> *generators)

{
  __uniq_ptr_impl<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
  _Var1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pvVar6;
  bool bVar7;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  allLocalShrinks;
  tuple<std::vector<int,_std::allocator<int>_>_> local_58;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_40;
  
  _Var1._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
  .
  super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
  ._M_head_impl =
       (generators->
       super__Tuple_impl<0UL,_cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_>).
       super__Head_base<0UL,_cppqc::Generator<std::vector<int,_std::allocator<int>_>_>,_false>.
       _M_head_impl.m_gen._M_t.
       super___uniq_ptr_impl<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
       ._M_t;
  (**(code **)(*(long *)_Var1._M_t.
                        super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
                        .
                        super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
                        ._M_head_impl + 0x18))
            (&local_40,
             _Var1._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
             .
             super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
             ._M_head_impl,shrinkInput);
  for (pvVar6 = local_40.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 != local_40.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pvVar6 = pvVar6 + 1) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_58,
               (vector<int,_std::allocator<int>_> *)shrinkInput);
    piVar5 = local_58.super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>.
             super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar3 = (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar4 = (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    piVar2 = (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
    (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
         = local_58.super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>.
           super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = local_58.super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>.
                super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish;
    (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_58.super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>.
         super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar7 = local_58.super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>.
            super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            != (pointer)0x0;
    local_58.super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>.
    super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = piVar3;
    local_58.super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>.
    super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = piVar4
    ;
    local_58.super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>.
    super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
         = piVar2;
    if (bVar7) {
      operator_delete(piVar5);
    }
    std::
    vector<std::tuple<std::vector<int,std::allocator<int>>>,std::allocator<std::tuple<std::vector<int,std::allocator<int>>>>>
    ::emplace_back<std::tuple<std::vector<int,std::allocator<int>>>>
              ((vector<std::tuple<std::vector<int,std::allocator<int>>>,std::allocator<std::tuple<std::vector<int,std::allocator<int>>>>>
                *)shrinkOutput,&local_58);
    if (local_58.super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>.
        super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_58.super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_>.
                      super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>.
                      _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_40);
  return;
}

Assistant:

static void appendShrinks(const std::tuple<T...>& shrinkInput,
                            std::vector<std::tuple<T...>>& shrinkOutput,
                            const Generators& generators) {
    // Compute all shrink combinations for the tuple
    // element at the position "offset".
    // All other elements will not be changed.
    static_assert(offset >= 0 && offset < sizeof...(T), "offset out of bounds");
    auto allLocalShrinks =
        std::get<offset>(generators).shrink(std::get<offset>(shrinkInput));
    for (auto&& localShrink : allLocalShrinks) {
      auto copiedShrinkInput = shrinkInput;
      std::get<offset>(copiedShrinkInput) = std::move(localShrink);
      shrinkOutput.push_back(std::move(copiedShrinkInput));
    }

    // continue recursion (from right to left)
    TupleGeneratorHelper_shrink<offset - 1, T...>::appendShrinks(
        shrinkInput, shrinkOutput, generators);
  }